

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

HighsInt __thiscall
HighsSimplexAnalysis::simplexTimerNumCall
          (HighsSimplexAnalysis *this,HighsInt simplex_clock,HighsInt thread_id)

{
  HighsTimer *pHVar1;
  reference pvVar2;
  reference pvVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  HighsInt local_4;
  
  if ((*(byte *)(in_RDI + 0xf3) & 1) == 0) {
    local_4 = -1;
  }
  else {
    pvVar2 = std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::operator[]
                       ((vector<HighsTimerClock,_std::allocator<HighsTimerClock>_> *)(in_RDI + 8),
                        (long)in_EDX);
    pHVar1 = pvVar2->timer_pointer_;
    pvVar2 = std::vector<HighsTimerClock,_std::allocator<HighsTimerClock>_>::operator[]
                       ((vector<HighsTimerClock,_std::allocator<HighsTimerClock>_> *)(in_RDI + 8),
                        (long)in_EDX);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&pvVar2->clock_,(long)in_ESI);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       (&pHVar1->clock_num_call,(long)*pvVar3);
    local_4 = *pvVar3;
  }
  return local_4;
}

Assistant:

HighsInt HighsSimplexAnalysis::simplexTimerNumCall(const HighsInt simplex_clock,
                                                   const HighsInt thread_id) {
  if (!analyse_simplex_time) return -1;
  // assert(analyse_simplex_time);
  return thread_simplex_clocks[thread_id]
      .timer_pointer_
      ->clock_num_call[thread_simplex_clocks[thread_id].clock_[simplex_clock]];
}